

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  ImVector<ImDrawChannel> *this_00;
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ImDrawChannel *pIVar4;
  int i;
  int i_00;
  ImDrawCmd IStack_68;
  
  if ((this->_Current != 0) || (1 < this->_Count)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x5a4,"Split","ImGui ASSERT FAILED: %s",
                "_Current == 0 && _Count <= 1 && \"Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.\""
               );
  }
  this_00 = &this->_Channels;
  iVar1 = (this->_Channels).Size;
  if (iVar1 < channels_count) {
    ImVector<ImDrawChannel>::resize(this_00,channels_count);
  }
  this->_Count = channels_count;
  pIVar4 = ImVector<ImDrawChannel>::operator[](this_00,0);
  (pIVar4->_CmdBuffer).Size = 0;
  (pIVar4->_CmdBuffer).Capacity = 0;
  (pIVar4->_CmdBuffer).Data = (ImDrawCmd *)0x0;
  (pIVar4->_IdxBuffer).Size = 0;
  (pIVar4->_IdxBuffer).Capacity = 0;
  (pIVar4->_IdxBuffer).Data = (unsigned_short *)0x0;
  for (i_00 = 1; i_00 < channels_count; i_00 = i_00 + 1) {
    pIVar4 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
    if (i_00 < iVar1) {
      ImVector<ImDrawCmd>::resize(&pIVar4->_CmdBuffer,0);
      pIVar4 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
      ImVector<unsigned_short>::resize(&pIVar4->_IdxBuffer,0);
    }
    else {
      (pIVar4->_IdxBuffer).Size = 0;
      (pIVar4->_IdxBuffer).Capacity = 0;
      (pIVar4->_IdxBuffer).Data = (unsigned_short *)0x0;
      (pIVar4->_CmdBuffer).Size = 0;
      (pIVar4->_CmdBuffer).Capacity = 0;
      (pIVar4->_CmdBuffer).Data = (ImDrawCmd *)0x0;
    }
    pIVar4 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
    if ((pIVar4->_CmdBuffer).Size == 0) {
      IStack_68.UserCallback._4_4_ = 0;
      IStack_68.UserCallbackData = (void *)0x0;
      IStack_68.IdxOffset = 0;
      IStack_68.ElemCount = 0;
      IStack_68._36_4_ = 0;
      IStack_68.UserCallback._0_4_ = 0;
      IStack_68.ClipRect.x = (draw_list->_CmdHeader).ClipRect.x;
      IStack_68.ClipRect.y = (draw_list->_CmdHeader).ClipRect.y;
      uVar2 = (draw_list->_CmdHeader).ClipRect.z;
      uVar3 = (draw_list->_CmdHeader).ClipRect.w;
      IStack_68._20_8_ = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
      IStack_68.TextureId._0_4_ =
           (undefined4)((ulong)*(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w >> 0x20);
      IStack_68.ClipRect.z = (float)uVar2;
      IStack_68.ClipRect.w = (float)uVar3;
      pIVar4 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
      ImVector<ImDrawCmd>::push_back(&pIVar4->_CmdBuffer,&IStack_68);
    }
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
        if (_Channels[i]._CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            ImDrawCmd_HeaderCopy(&draw_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
            _Channels[i]._CmdBuffer.push_back(draw_cmd);
        }
    }
}